

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_resample_filters.cpp
# Opt level: O0

float crnlib::lanczos6_filter(float t)

{
  double dVar1;
  double dVar2;
  undefined4 local_10;
  undefined4 local_c;
  float t_local;
  
  local_10 = t;
  if (t < 0.0) {
    local_10 = -t;
  }
  if (6.0 <= local_10) {
    local_c = 0.0;
  }
  else {
    dVar1 = sinc((double)local_10);
    dVar2 = sinc((double)(local_10 / 6.0));
    local_c = clean(dVar1 * dVar2);
  }
  return local_c;
}

Assistant:

static float lanczos6_filter(float t)
    {
        if (t < 0.0f)
        {
            t = -t;
        }

        if (t < 6.0f)
        {
            return clean(sinc(t) * sinc(t / 6.0f));
        }
        else
        {
            return (0.0f);
        }
    }